

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall QCss::Parser::testAndParseUri(Parser *this,QString *uri)

{
  bool bVar1;
  int iVar2;
  QString *in_RSI;
  Parser *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  int rewind;
  QString args;
  QString name;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar4;
  Parser *this_00;
  bool local_39;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = in_RDI->index;
  this_00 = in_RDI;
  bVar1 = testFunction((Parser *)0xa3ba16);
  if (bVar1) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0xa3ba52);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0xa3ba80);
    bVar1 = parseFunction(this_00,in_RSI,(QString *)CONCAT44(iVar4,in_stack_ffffffffffffffa8));
    if (bVar1) {
      QVar3 = Qt::Literals::StringLiterals::operator____L1(in_stack_ffffffffffffff98,(size_t)in_RDI)
      ;
      iVar2 = QString::compare((QLatin1String *)&local_20,(CaseSensitivity)QVar3.m_size);
      if (iVar2 == 0) {
        QString::operator=(in_RSI,(QString *)&local_38);
        removeOptionalQuotes((QString *)in_RDI);
        local_39 = true;
      }
      else {
        in_RDI->index = iVar4;
        local_39 = false;
      }
    }
    else {
      in_RDI->index = iVar4;
      local_39 = false;
    }
    QString::~QString((QString *)0xa3bb34);
    QString::~QString((QString *)0xa3bb3e);
  }
  else {
    local_39 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool Parser::testAndParseUri(QString *uri)
{
    const int rewind = index;
    if (!testFunction()) return false;

    QString name, args;
    if (!parseFunction(&name, &args)) {
        index = rewind;
        return false;
    }
    if (name.compare("url"_L1, Qt::CaseInsensitive) != 0) {
        index = rewind;
        return false;
    }
    *uri = args;
    removeOptionalQuotes(uri);
    return true;
}